

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_agents.c
# Opt level: O3

REF_STATUS ref_agents_inspect(REF_AGENTS ref_agents)

{
  uint uVar1;
  REF_AGENT_STRUCT *pRVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  
  uVar3 = (ulong)(uint)ref_agents->max;
  if (0 < ref_agents->max) {
    lVar4 = 8;
    uVar5 = 0;
    do {
      pRVar2 = ref_agents->agent;
      uVar1 = *(uint *)((long)pRVar2->xyz + lVar4 + -0x38);
      if (uVar1 != 0) {
        printf("%2d: %2d mode %2d prev %2d next\n",uVar5 & 0xffffffff,(ulong)uVar1,
               (ulong)*(uint *)((long)pRVar2->xyz + lVar4 + -0x34),
               (ulong)*(uint *)((long)pRVar2->xyz + lVar4 + -0x30));
        uVar3 = (ulong)(uint)ref_agents->max;
      }
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x68;
    } while ((long)uVar5 < (long)(int)uVar3);
  }
  printf("%d n %d max %d\nblank %d last\n",(ulong)(uint)ref_agents->n,uVar3,
         (ulong)(uint)ref_agents->blank,(ulong)(uint)ref_agents->last);
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_agents_inspect(REF_AGENTS ref_agents) {
  REF_INT id;
  for (id = 0; id < ref_agents->max; id++) {
    if (REF_AGENT_UNUSED != ref_agent_mode(ref_agents, id))
      printf("%2d: %2d mode %2d prev %2d next\n", id,
             (int)ref_agent_mode(ref_agents, id),
             ref_agent_previous(ref_agents, id),
             ref_agent_next(ref_agents, id));
  }
  printf("%d n %d max %d\nblank %d last\n", ref_agents->n, ref_agents->max,
         ref_agents->blank, ref_agents->last);

  return REF_SUCCESS;
}